

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

TestCaseGroup * vkt::texture::anon_unknown_3::create2DSizeTests(TestContext *testCtx)

{
  undefined8 testCtx_00;
  TestCaseGroup *pTVar1;
  int *piVar2;
  ostream *poVar3;
  Texture2DGradientTestCase *this;
  char *name;
  TestNode *this_00;
  Vector<int,_3> local_284;
  TextureFormat local_278;
  string local_270 [32];
  Texture2DGradientTestCase *local_250;
  Texture2DGradientTestCase *testCase;
  ostringstream caseName;
  uint local_cc;
  uint local_c8;
  deUint32 wrappingModeNdx;
  deUint32 mipmapFilterNdx;
  deUint32 minFilterNdx;
  deUint32 magFilterNdx;
  deUint32 sizeNdx;
  IVec3 sizes [9];
  VkSamplerAddressMode wrappingModes [2];
  VkSamplerMipmapMode mipmapFilters [2];
  VkFilter filters [2];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> tests;
  TestContext *testCtx_local;
  
  tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    tests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"sizes","Various size and filtering combinations");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)filters + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar1
            );
  mipmapFilters[0] = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  mipmapFilters[1] = VK_SAMPLER_MIPMAP_MODE_LINEAR;
  wrappingModes[0] = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  wrappingModes[1] = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
  stack0xffffffffffffffb8 = 0x200000000;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&magFilterNdx,2,2,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[0].m_data + 1),2,3,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[1].m_data + 1),3,7,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[2].m_data + 1),4,8,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[3].m_data + 1),0x1f,0x37,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[4].m_data + 1),0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[5].m_data + 1),0x20,0x40,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[6].m_data + 1),0x39,0x23,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(sizes[7].m_data + 1),0x80,0x80,1);
  for (minFilterNdx = 0; minFilterNdx < 9; minFilterNdx = minFilterNdx + 1) {
    for (mipmapFilterNdx = 0; mipmapFilterNdx < 2; mipmapFilterNdx = mipmapFilterNdx + 1) {
      for (wrappingModeNdx = 0; wrappingModeNdx < 2; wrappingModeNdx = wrappingModeNdx + 1) {
        for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
          for (local_cc = 0; local_cc < 2; local_cc = local_cc + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&testCase);
            piVar2 = tcu::Vector<int,_3>::operator[]
                               ((Vector<int,_3> *)(&magFilterNdx + (ulong)minFilterNdx * 3),0);
            poVar3 = (ostream *)std::ostream::operator<<(&testCase,*piVar2);
            poVar3 = std::operator<<(poVar3,"x");
            piVar2 = tcu::Vector<int,_3>::operator[]
                               ((Vector<int,_3> *)(&magFilterNdx + (ulong)minFilterNdx * 3),1);
            std::ostream::operator<<(poVar3,*piVar2);
            if (mipmapFilters[mipmapFilterNdx] == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
              std::operator<<((ostream *)&testCase,"_nearest");
            }
            else if (mipmapFilters[mipmapFilterNdx] == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
              std::operator<<((ostream *)&testCase,"_linear");
            }
            if (mipmapFilters[wrappingModeNdx] == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
              std::operator<<((ostream *)&testCase,"_nearest");
            }
            else if (mipmapFilters[wrappingModeNdx] == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
              std::operator<<((ostream *)&testCase,"_linear");
            }
            if (wrappingModes[local_c8] == VK_SAMPLER_ADDRESS_MODE_REPEAT) {
              std::operator<<((ostream *)&testCase,"_mipmap_nearest");
            }
            else if (wrappingModes[local_c8] == VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT) {
              std::operator<<((ostream *)&testCase,"_mipmap_linear");
            }
            if (sizes[8].m_data[(ulong)local_cc + 2] == 0) {
              std::operator<<((ostream *)&testCase,"_repeat");
            }
            else if (sizes[8].m_data[(ulong)local_cc + 2] == 2) {
              std::operator<<((ostream *)&testCase,"_clamp");
            }
            this = (Texture2DGradientTestCase *)operator_new(0x188);
            testCtx_00 = tests.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_;
            std::__cxx11::ostringstream::str();
            name = (char *)std::__cxx11::string::c_str();
            local_278 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
            tcu::Vector<int,_3>::Vector
                      (&local_284,(Vector<int,_3> *)(&magFilterNdx + (ulong)minFilterNdx * 3));
            Texture2DGradientTestCase::Texture2DGradientTestCase
                      (this,(TestContext *)testCtx_00,name,"...",local_278,&local_284,
                       mipmapFilters[mipmapFilterNdx],mipmapFilters[wrappingModeNdx],
                       wrappingModes[local_c8],sizes[8].m_data[(ulong)local_cc + 2],false);
            std::__cxx11::string::~string(local_270);
            local_250 = this;
            this_00 = &de::details::
                       UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                       operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                   *)local_20)->super_TestNode;
            tcu::TestNode::addChild(this_00,(TestNode *)local_250);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testCase);
          }
        }
      }
    }
  }
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

TestCaseGroup* create2DSizeTests (TestContext& testCtx)
{
	de::MovePtr<TestCaseGroup> tests(
		new TestCaseGroup(testCtx, "sizes", "Various size and filtering combinations"));

	const VkFilter filters[2] =
	{
		VK_FILTER_NEAREST,
		VK_FILTER_LINEAR
	};

	const VkSamplerMipmapMode mipmapFilters[2] =
	{
		VK_SAMPLER_MIPMAP_MODE_NEAREST,
		VK_SAMPLER_MIPMAP_MODE_LINEAR
	};

	const VkSamplerAddressMode wrappingModes[2] =
	{
		VK_SAMPLER_ADDRESS_MODE_REPEAT,
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE
	};

	const IVec3 sizes[] =
	{
		IVec3(2, 2, 1),
		IVec3(2, 3, 1),
		IVec3(3, 7, 1),
		IVec3(4, 8, 1),
		IVec3(31, 55, 1),
		IVec3(32, 32, 1),
		IVec3(32, 64, 1),
		IVec3(57, 35, 1),
		IVec3(128, 128, 1)
	};


	for (deUint32 sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); ++sizeNdx)
	{
		for (deUint32 magFilterNdx = 0; magFilterNdx < 2; ++magFilterNdx)
		{
			for (deUint32 minFilterNdx = 0; minFilterNdx < 2; ++minFilterNdx)
			{
				for (deUint32 mipmapFilterNdx = 0; mipmapFilterNdx < 2; ++mipmapFilterNdx)
				{
					for (deUint32 wrappingModeNdx = 0; wrappingModeNdx < 2; ++wrappingModeNdx)
					{
						std::ostringstream caseName;

						caseName << sizes[sizeNdx][0] << "x" << sizes[sizeNdx][1];

						switch (filters[magFilterNdx])
						{
							case VK_FILTER_NEAREST:
								caseName << "_nearest";
								break;

							case VK_FILTER_LINEAR:
								caseName << "_linear";
								break;

							default:
								break;
						}

						switch (filters[minFilterNdx])
						{
							case VK_FILTER_NEAREST:
								caseName << "_nearest";
								break;

							case VK_FILTER_LINEAR:
								caseName << "_linear";
								break;

							default:
								break;
						}

						switch (mipmapFilters[mipmapFilterNdx])
						{
							case VK_SAMPLER_MIPMAP_MODE_NEAREST:
								caseName << "_mipmap_nearest";
								break;

							case VK_SAMPLER_MIPMAP_MODE_LINEAR:
								caseName << "_mipmap_linear";
								break;

							default:
								break;
						}

						switch (wrappingModes[wrappingModeNdx])
						{
							case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:
								caseName << "_clamp";
								break;

							case VK_SAMPLER_ADDRESS_MODE_REPEAT:
								caseName << "_repeat";
								break;

							default:
								break;
						}

						Texture2DGradientTestCase* testCase =
							new Texture2DGradientTestCase(
								testCtx,
								caseName.str().c_str(),
								"...",
								mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM),
								sizes[sizeNdx],
								filters[magFilterNdx],
								filters[minFilterNdx],
								mipmapFilters[mipmapFilterNdx],
								wrappingModes[wrappingModeNdx],
								false);

						tests->addChild(testCase);
					}
				}
			}
		}
	}

	return tests.release();
}